

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O0

void __thiscall
fasttext::NegativeSamplingLoss::NegativeSamplingLoss
          (NegativeSamplingLoss *this,shared_ptr<fasttext::Matrix> *wo,int neg,
          vector<long,_std::allocator<long>_> *targetCounts)

{
  double dVar1;
  size_type sVar2;
  const_reference pvVar3;
  vector<long,_std::allocator<long>_> *in_RCX;
  undefined4 in_EDX;
  undefined8 *in_RDI;
  size_t j;
  real c;
  size_t i_1;
  size_t i;
  real z;
  shared_ptr<fasttext::Matrix> *in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  undefined8 local_68;
  undefined8 local_60;
  ulong local_50;
  ulong local_40;
  ulong local_38;
  float local_30;
  
  BinaryLogisticLoss::BinaryLogisticLoss
            ((BinaryLogisticLoss *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68);
  *in_RDI = &PTR__NegativeSamplingLoss_0021d920;
  *(undefined4 *)(in_RDI + 8) = in_EDX;
  in_RDI[9] = 0;
  in_RDI[10] = 0;
  in_RDI[0xb] = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1d48ca);
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)0x1d48d8);
  local_30 = 0.0;
  for (local_38 = 0; sVar2 = std::vector<long,_std::allocator<long>_>::size(in_RCX),
      local_38 < sVar2; local_38 = local_38 + 1) {
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](in_RCX,local_38);
    dVar1 = pow((double)*pvVar3,0.5);
    local_30 = (float)((double)local_30 + dVar1);
  }
  for (local_40 = 0; sVar2 = std::vector<long,_std::allocator<long>_>::size(in_RCX),
      local_40 < sVar2; local_40 = local_40 + 1) {
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](in_RCX,local_40);
    dVar1 = pow((double)*pvVar3,0.5);
    local_50 = 0;
    while( true ) {
      in_stack_ffffffffffffff70 = (float)(long)local_50;
      in_stack_ffffffffffffff74 = (float)local_50;
      if (((float)dVar1 * 1e+07) / local_30 <= in_stack_ffffffffffffff74) break;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (value_type_conflict1 *)in_stack_ffffffffffffff68);
      local_50 = local_50 + 1;
    }
  }
  std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)(in_RDI + 9));
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (unsigned_long)in_stack_ffffffffffffff68,0x1d4aa8);
  in_RDI[0xc] = local_68;
  in_RDI[0xd] = local_60;
  return;
}

Assistant:

NegativeSamplingLoss::NegativeSamplingLoss(
    std::shared_ptr<Matrix>& wo,
    int neg,
    const std::vector<int64_t>& targetCounts)
    : BinaryLogisticLoss(wo), neg_(neg), negatives_(), uniform_() {
  real z = 0.0;
  for (size_t i = 0; i < targetCounts.size(); i++) {
    z += pow(targetCounts[i], 0.5);
  }
  for (size_t i = 0; i < targetCounts.size(); i++) {
    real c = pow(targetCounts[i], 0.5);
    for (size_t j = 0; j < c * NegativeSamplingLoss::NEGATIVE_TABLE_SIZE / z;
         j++) {
      negatives_.push_back(i);
    }
  }
  uniform_ = std::uniform_int_distribution<size_t>(0, negatives_.size() - 1);
}